

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O0

int __thiscall CVmFile::dup(CVmFile *this,int __fd)

{
  osfildef *fp;
  osfildef *fpdup;
  char *in_stack_ffffffffffffffd0;
  osfildef *in_stack_ffffffffffffffd8;
  CVmFile *local_8;
  
  fp = osfdup(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (fp == (osfildef *)0x0) {
    local_8 = (CVmFile *)0x0;
  }
  else {
    local_8 = (CVmFile *)operator_new(0x10);
    CVmFile(local_8,fp,this->seek_base_);
  }
  return (int)local_8;
}

Assistant:

CVmFile *dup(const char *mode)
    {
        /* duplicate our file handle */
        osfildef *fpdup = osfdup(fp_, mode);
        if (fpdup == 0)
            return 0;

        /* create a new CVmFile wrapper for the new handle */
        return new CVmFile(fpdup, seek_base_);
    }